

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O0

void __thiscall Clause::print(Clause *this)

{
  Goal *in_RDI;
  
  (*(in_RDI->head->super_Term)._vptr_Term[3])();
  std::operator<<((ostream *)&std::cout," :- ");
  if (in_RDI->tail == (Goal *)0x0) {
    std::operator<<((ostream *)&std::cout,"true");
  }
  else {
    Goal::print(in_RDI);
  }
  return;
}

Assistant:

void print() const
    {
        head->print();
        std::cout << " :- ";
        if (body)
            body->print();
        else
            std::cout << "true";
    }